

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockfilter_index_tests.cpp
# Opt level: O2

void __thiscall
blockfilter_index_tests::blockfilter_index_init_destroy::test_method
          (blockfilter_index_init_destroy *this)

{
  function<std::unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>_()>
  make_chain;
  function<std::unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>_()>
  make_chain_00;
  function<void_(BlockFilterIndex_&)> fn;
  function<std::unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>_()>
  make_chain_01;
  bool bVar1;
  readonly_property<bool> rVar2;
  BlockFilterIndex *pBVar3;
  iterator in_R8;
  iterator pvVar4;
  iterator in_R9;
  iterator pvVar5;
  int *piVar6;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  undefined4 uVar7;
  undefined4 in_stack_fffffffffffffccc;
  undefined4 uVar8;
  BlockFilterType BVar9;
  check_type cVar11;
  assertion_result *ar;
  _Manager_type in_stack_fffffffffffffcd8;
  _Manager_type p_Var10;
  _Invoker_type in_stack_fffffffffffffce0;
  char *local_318;
  char *local_310;
  undefined1 *local_308;
  undefined1 *local_300;
  char *local_2f8;
  char *local_2f0;
  char *local_2e8;
  char *local_2e0;
  _Any_data local_2d8;
  code *local_2c8;
  code *local_2c0;
  undefined1 *local_2b8;
  undefined1 *local_2b0;
  char *local_2a8;
  char *local_2a0;
  char *local_298;
  char *local_290;
  undefined1 *local_288;
  undefined1 *local_280;
  char *local_278;
  char *local_270;
  char *local_268;
  char *local_260;
  undefined1 *local_258;
  undefined1 *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  char *local_230;
  undefined1 *local_228;
  undefined1 *local_220;
  char *local_218;
  char *local_210;
  char *local_208;
  char *local_200;
  undefined1 *local_1f8;
  undefined1 *local_1f0;
  char *local_1e8;
  char *local_1e0;
  _Any_data local_1d8;
  code *local_1c8;
  code *local_1c0;
  int iter_count;
  char *local_1b0;
  char *local_1a8;
  _Any_data local_1a0;
  code *local_190;
  code *local_188;
  undefined1 *local_180;
  undefined1 *local_178;
  char *local_170;
  char *local_168;
  char *local_160;
  char *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  char *local_130;
  char *local_128;
  undefined1 *local_120;
  undefined1 *local_118;
  char *local_110;
  char *local_108;
  char *local_100;
  char *local_f8;
  _Any_data local_f0;
  code *local_e0;
  code *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  lazy_ostream local_90;
  undefined1 *local_80;
  char **local_78;
  assertion_result local_70;
  undefined1 *local_58;
  undefined1 *local_50;
  char *local_48;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pBVar3 = GetBlockFilterIndex((BlockFilterType)((uint)in_stack_fffffffffffffccc >> 0x18));
  local_48 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
  ;
  local_40 = "";
  local_58 = &boost::unit_test::basic_cstring<char_const>::null;
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x116;
  file.m_begin = (iterator)&local_48;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_58,msg);
  local_70.m_message.px = (element_type *)0x0;
  local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = "filter_index == nullptr";
  local_98 = "";
  local_90.m_empty = false;
  local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_80 = boost::unit_test::lazy_ostream::inst;
  local_b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
  ;
  local_a8 = "";
  uVar7 = 0;
  uVar8 = 0;
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  local_78 = &local_a0;
  local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(pBVar3 == (BlockFilterIndex *)0x0);
  boost::test_tools::tt_detail::report_assertion
            (&local_70,&local_90,1,0,WARN,_cVar11,(size_t)&local_b0,0x116);
  boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
  local_c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
  ;
  local_b8 = "";
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = pvVar5;
  msg_00.m_begin = pvVar4;
  file_00.m_end = (iterator)0x118;
  file_00.m_begin = (iterator)&local_c0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_d0,msg_00
            );
  local_f0._8_8_ = 0;
  local_d8 = std::
             _Function_handler<std::unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp:280:5)>
             ::_M_invoke;
  local_e0 = std::
             _Function_handler<std::unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp:280:5)>
             ::_M_manager;
  make_chain.super__Function_base._M_functor._4_4_ = uVar8;
  make_chain.super__Function_base._M_functor._0_4_ = uVar7;
  make_chain.super__Function_base._M_functor._8_8_ = (undefined8)_cVar11;
  make_chain.super__Function_base._M_manager = in_stack_fffffffffffffcd8;
  make_chain._M_invoker = in_stack_fffffffffffffce0;
  local_f0._M_unused._M_object = this;
  local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       InitBlockFilterIndex(make_chain,(BlockFilterType)&local_f0,0,false,true);
  local_70.m_message.px = (element_type *)0x0;
  local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = 
  "InitBlockFilterIndex([&]{ return interfaces::MakeChain(m_node); }, BlockFilterType::BASIC, 1 << 20, true, false)"
  ;
  local_98 = "";
  local_90.m_empty = false;
  local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_80 = boost::unit_test::lazy_ostream::inst;
  local_100 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
  ;
  local_f8 = "";
  BVar9 = BASIC;
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  local_78 = &local_a0;
  boost::test_tools::tt_detail::report_assertion
            (&local_70,&local_90,1,0,WARN,_cVar11,(size_t)&local_100,0x118);
  boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
  std::_Function_base::~_Function_base((_Function_base *)&local_f0);
  pBVar3 = GetBlockFilterIndex(BVar9);
  local_110 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
  ;
  local_108 = "";
  local_120 = &boost::unit_test::basic_cstring<char_const>::null;
  local_118 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = pvVar5;
  msg_01.m_begin = pvVar4;
  file_01.m_end = (iterator)0x11b;
  file_01.m_begin = (iterator)&local_110;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_120,
             msg_01);
  local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(pBVar3 != (BlockFilterIndex *)0x0);
  local_70.m_message.px = (element_type *)0x0;
  local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = "filter_index != nullptr";
  local_98 = "";
  local_90.m_empty = false;
  local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_80 = boost::unit_test::lazy_ostream::inst;
  local_78 = &local_a0;
  local_130 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
  ;
  local_128 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_70,&local_90,1,0,WARN,_cVar11,(size_t)&local_130,0x11b);
  boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
  local_140 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
  ;
  local_138 = "";
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = pvVar5;
  msg_02.m_begin = pvVar4;
  file_02.m_end = (iterator)0x11c;
  file_02.m_begin = (iterator)&local_140;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_150,
             msg_02);
  local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(pBVar3->m_filter_type == BASIC);
  local_70.m_message.px = (element_type *)0x0;
  local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = "filter_index->GetFilterType() == BlockFilterType::BASIC";
  local_98 = "";
  local_90.m_empty = false;
  local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_80 = boost::unit_test::lazy_ostream::inst;
  local_78 = &local_a0;
  local_160 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
  ;
  local_158 = "";
  uVar7 = 0;
  uVar8 = 0;
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_70,&local_90,1,0,WARN,_cVar11,(size_t)&local_160,0x11c);
  boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
  local_170 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
  ;
  local_168 = "";
  local_180 = &boost::unit_test::basic_cstring<char_const>::null;
  local_178 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_03.m_end = pvVar5;
  msg_03.m_begin = pvVar4;
  file_03.m_end = (iterator)0x11f;
  file_03.m_begin = (iterator)&local_170;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_180,
             msg_03);
  local_1a0._8_8_ = 0;
  local_188 = std::
              _Function_handler<std::unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp:287:5)>
              ::_M_invoke;
  local_190 = std::
              _Function_handler<std::unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp:287:5)>
              ::_M_manager;
  make_chain_00.super__Function_base._M_functor._4_4_ = uVar8;
  make_chain_00.super__Function_base._M_functor._0_4_ = uVar7;
  make_chain_00.super__Function_base._M_functor._8_8_ = (undefined8)_cVar11;
  make_chain_00.super__Function_base._M_manager = in_stack_fffffffffffffcd8;
  make_chain_00._M_invoker = (_Invoker_type)this;
  local_1a0._M_unused._M_object = this;
  bVar1 = InitBlockFilterIndex(make_chain_00,(BlockFilterType)&local_1a0,0,false,true);
  ar = &local_70;
  local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar1;
  local_70.m_message.px = (element_type *)0x0;
  local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = 
  "!InitBlockFilterIndex([&]{ return interfaces::MakeChain(m_node); }, BlockFilterType::BASIC, 1 << 20, true, false)"
  ;
  local_98 = "";
  local_90.m_empty = false;
  local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_80 = boost::unit_test::lazy_ostream::inst;
  local_78 = &local_a0;
  local_1b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
  ;
  local_1a8 = "";
  uVar7 = 0;
  uVar8 = 0;
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (ar,&local_90,1,0,WARN,_cVar11,(size_t)&local_1b0,0x11f);
  boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
  std::_Function_base::~_Function_base((_Function_base *)&local_1a0);
  local_1d8._M_unused._M_object = &iter_count;
  iter_count = 0;
  local_1d8._8_8_ = 0;
  local_1c0 = std::
              _Function_handler<void_(BlockFilterIndex_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp:290:29)>
              ::_M_invoke;
  local_1c8 = std::
              _Function_handler<void_(BlockFilterIndex_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp:290:29)>
              ::_M_manager;
  fn.super__Function_base._M_functor._4_4_ = uVar8;
  fn.super__Function_base._M_functor._0_4_ = uVar7;
  fn.super__Function_base._M_functor._8_8_ = (undefined8)_cVar11;
  fn.super__Function_base._M_manager = in_stack_fffffffffffffcd8;
  fn._M_invoker = (_Invoker_type)this;
  ForEachBlockFilterIndex(fn);
  std::_Function_base::~_Function_base((_Function_base *)&local_1d8);
  local_1e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
  ;
  local_1e0 = "";
  local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_04.m_end = pvVar5;
  msg_04.m_begin = pvVar4;
  file_04.m_end = (iterator)0x123;
  file_04.m_begin = (iterator)&local_1e8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_1f8,
             msg_04);
  local_90.m_empty = false;
  local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139f30;
  local_80 = boost::unit_test::lazy_ostream::inst;
  local_78 = (char **)0xc694e1;
  local_208 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
  ;
  local_200 = "";
  local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0x1;
  local_70._1_3_ = 0;
  p_Var10 = (_Manager_type)0xc69f21;
  BVar9 = BASIC;
  pvVar4 = (iterator)0x2;
  piVar6 = &iter_count;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_90,&local_208,0x123,1,2,piVar6,0xb5feaa);
  local_218 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
  ;
  local_210 = "";
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_05.m_end = (iterator)piVar6;
  msg_05.m_begin = pvVar4;
  file_05.m_end = (iterator)0x125;
  file_05.m_begin = (iterator)&local_218;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_228,
             msg_05);
  rVar2.super_class_property<bool>.value = (class_property<bool>)DestroyBlockFilterIndex(BVar9);
  local_70.m_message.px = (element_type *)0x0;
  local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = "DestroyBlockFilterIndex(BlockFilterType::BASIC)";
  local_98 = "";
  local_90.m_empty = false;
  local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_80 = boost::unit_test::lazy_ostream::inst;
  local_238 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
  ;
  local_230 = "";
  BVar9 = BASIC;
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  local_78 = &local_a0;
  local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)rVar2.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            (&local_70,&local_90,1,0,WARN,(check_type)ar,(size_t)&local_238,0x125);
  boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
  local_248 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
  ;
  local_240 = "";
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_06.m_end = pvVar5;
  msg_06.m_begin = pvVar4;
  file_06.m_end = (iterator)0x128;
  file_06.m_begin = (iterator)&local_248;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_258,
             msg_06);
  bVar1 = DestroyBlockFilterIndex(BVar9);
  local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar1;
  local_70.m_message.px = (element_type *)0x0;
  local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = "!DestroyBlockFilterIndex(BlockFilterType::BASIC)";
  local_98 = "";
  local_90.m_empty = false;
  local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_80 = boost::unit_test::lazy_ostream::inst;
  local_268 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
  ;
  local_260 = "";
  BVar9 = BASIC;
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  local_78 = &local_a0;
  boost::test_tools::tt_detail::report_assertion
            (&local_70,&local_90,1,0,WARN,(check_type)ar,(size_t)&local_268,0x128);
  boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
  pBVar3 = GetBlockFilterIndex(BVar9);
  local_278 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
  ;
  local_270 = "";
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  local_280 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_07.m_end = pvVar5;
  msg_07.m_begin = pvVar4;
  file_07.m_end = (iterator)0x12b;
  file_07.m_begin = (iterator)&local_278;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_288,
             msg_07);
  local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(pBVar3 == (BlockFilterIndex *)0x0);
  local_70.m_message.px = (element_type *)0x0;
  local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = "filter_index == nullptr";
  local_98 = "";
  local_90.m_empty = false;
  local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_80 = boost::unit_test::lazy_ostream::inst;
  local_298 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
  ;
  local_290 = "";
  uVar7 = 0;
  uVar8 = 0;
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  local_78 = &local_a0;
  boost::test_tools::tt_detail::report_assertion
            (&local_70,&local_90,1,0,WARN,(check_type)ar,(size_t)&local_298,299);
  boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
  local_2a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
  ;
  local_2a0 = "";
  local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_08.m_end = pvVar5;
  msg_08.m_begin = pvVar4;
  file_08.m_end = (iterator)0x12e;
  file_08.m_begin = (iterator)&local_2a8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_2b8,
             msg_08);
  local_2d8._8_8_ = 0;
  local_2c0 = std::
              _Function_handler<std::unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp:302:5)>
              ::_M_invoke;
  local_2c8 = std::
              _Function_handler<std::unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp:302:5)>
              ::_M_manager;
  make_chain_01.super__Function_base._M_functor._4_4_ = uVar8;
  make_chain_01.super__Function_base._M_functor._0_4_ = uVar7;
  make_chain_01.super__Function_base._M_functor._8_8_ = ar;
  make_chain_01.super__Function_base._M_manager = p_Var10;
  make_chain_01._M_invoker = (_Invoker_type)this;
  local_2d8._M_unused._M_object = this;
  local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       InitBlockFilterIndex(make_chain_01,(BlockFilterType)&local_2d8,0,false,true);
  local_70.m_message.px = (element_type *)0x0;
  local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = 
  "InitBlockFilterIndex([&]{ return interfaces::MakeChain(m_node); }, BlockFilterType::BASIC, 1 << 20, true, false)"
  ;
  local_98 = "";
  local_90.m_empty = false;
  local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_80 = boost::unit_test::lazy_ostream::inst;
  local_2e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
  ;
  local_2e0 = "";
  BVar9 = BASIC;
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  local_78 = &local_a0;
  boost::test_tools::tt_detail::report_assertion
            (&local_70,&local_90,1,0,WARN,(check_type)ar,(size_t)&local_2e8,0x12e);
  boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
  std::_Function_base::~_Function_base((_Function_base *)&local_2d8);
  DestroyAllBlockFilterIndexes();
  pBVar3 = GetBlockFilterIndex(BVar9);
  local_2f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
  ;
  local_2f0 = "";
  local_308 = &boost::unit_test::basic_cstring<char_const>::null;
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_09.m_end = pvVar5;
  msg_09.m_begin = pvVar4;
  file_09.m_end = (iterator)0x133;
  file_09.m_begin = (iterator)&local_2f8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_308,
             msg_09);
  local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(pBVar3 == (BlockFilterIndex *)0x0);
  local_70.m_message.px = (element_type *)0x0;
  local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = "filter_index == nullptr";
  local_98 = "";
  local_90.m_empty = false;
  local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_80 = boost::unit_test::lazy_ostream::inst;
  local_318 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
  ;
  local_310 = "";
  local_78 = &local_a0;
  boost::test_tools::tt_detail::report_assertion
            (&local_70,&local_90,1,0,WARN,(check_type)ar,(size_t)&local_318,0x133);
  boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(blockfilter_index_init_destroy, BasicTestingSetup)
{
    BlockFilterIndex* filter_index;

    filter_index = GetBlockFilterIndex(BlockFilterType::BASIC);
    BOOST_CHECK(filter_index == nullptr);

    BOOST_CHECK(InitBlockFilterIndex([&]{ return interfaces::MakeChain(m_node); }, BlockFilterType::BASIC, 1 << 20, true, false));

    filter_index = GetBlockFilterIndex(BlockFilterType::BASIC);
    BOOST_CHECK(filter_index != nullptr);
    BOOST_CHECK(filter_index->GetFilterType() == BlockFilterType::BASIC);

    // Initialize returns false if index already exists.
    BOOST_CHECK(!InitBlockFilterIndex([&]{ return interfaces::MakeChain(m_node); }, BlockFilterType::BASIC, 1 << 20, true, false));

    int iter_count = 0;
    ForEachBlockFilterIndex([&iter_count](BlockFilterIndex& _index) { iter_count++; });
    BOOST_CHECK_EQUAL(iter_count, 1);

    BOOST_CHECK(DestroyBlockFilterIndex(BlockFilterType::BASIC));

    // Destroy returns false because index was already destroyed.
    BOOST_CHECK(!DestroyBlockFilterIndex(BlockFilterType::BASIC));

    filter_index = GetBlockFilterIndex(BlockFilterType::BASIC);
    BOOST_CHECK(filter_index == nullptr);

    // Reinitialize index.
    BOOST_CHECK(InitBlockFilterIndex([&]{ return interfaces::MakeChain(m_node); }, BlockFilterType::BASIC, 1 << 20, true, false));

    DestroyAllBlockFilterIndexes();

    filter_index = GetBlockFilterIndex(BlockFilterType::BASIC);
    BOOST_CHECK(filter_index == nullptr);
}